

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSynth.cpp
# Opt level: O1

void QReportHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  undefined4 local_5c;
  QArrayData *local_58;
  long local_50;
  long local_48;
  QArrayData *local_40;
  long local_38;
  long local_30;
  void *local_28;
  undefined4 *local_20;
  QArrayData **ppQStack_18;
  QArrayData **local_10;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == balloonMessageAppeared && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == masterVolumeChanged && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == reverbModeChanged && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
    if (pcVar2 == reverbTimeChanged && lVar3 == 0) {
      *puVar1 = 3;
      return;
    }
    if (pcVar2 == reverbLevelChanged && lVar3 == 0) {
      *puVar1 = 4;
      return;
    }
    if (pcVar2 == polyStateChanged && lVar3 == 0) {
      *puVar1 = 5;
      return;
    }
    if (pcVar2 == programChanged && lVar3 == 0) {
      *puVar1 = 6;
      return;
    }
    if (pcVar2 == lcdStateChanged && lVar3 == 0) {
      *puVar1 = 7;
      return;
    }
    if (pcVar2 != midiMessageLEDStateChanged || lVar3 != 0) {
      return;
    }
    *puVar1 = 8;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    local_20 = (undefined4 *)_a[1];
    ppQStack_18 = (QArrayData **)_a[2];
    iVar5 = 0;
    break;
  case 1:
    local_5c = *_a[1];
    local_20 = &local_5c;
    iVar5 = 1;
    break;
  case 2:
    local_5c = *_a[1];
    local_20 = &local_5c;
    iVar5 = 2;
    break;
  case 3:
    local_5c = *_a[1];
    local_20 = &local_5c;
    iVar5 = 3;
    break;
  case 4:
    local_5c = *_a[1];
    local_20 = &local_5c;
    iVar5 = 4;
    break;
  case 5:
    local_5c = *_a[1];
    local_20 = &local_5c;
    iVar5 = 5;
    break;
  case 6:
    plVar4 = (long *)_a[2];
    local_5c = *_a[1];
    local_40 = (QArrayData *)*plVar4;
    local_38 = plVar4[1];
    local_30 = plVar4[2];
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    plVar4 = (long *)_a[3];
    local_58 = (QArrayData *)*plVar4;
    local_50 = plVar4[1];
    local_48 = plVar4[2];
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_20 = &local_5c;
    local_28 = (void *)0x0;
    ppQStack_18 = &local_40;
    local_10 = &local_58;
    QMetaObject::activate(_o,&staticMetaObject,6,&local_28);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    if (local_40 == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    QArrayData::deallocate(local_40,2,8);
    return;
  case 7:
    QMetaObject::activate(_o,&staticMetaObject,7,(void **)0x0);
    return;
  case 8:
    local_20 = &local_5c;
    local_5c = CONCAT31(local_5c._1_3_,*_a[1]);
    iVar5 = 8;
    break;
  default:
    goto switchD_00127623_default;
  }
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
switchD_00127623_default:
  return;
}

Assistant:

void QReportHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QReportHandler *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->balloonMessageAppeared((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->masterVolumeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->reverbModeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->reverbTimeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->reverbLevelChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->polyStateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->programChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 7: _t->lcdStateChanged(); break;
        case 8: _t->midiMessageLEDStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QReportHandler::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::balloonMessageAppeared)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::masterVolumeChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbModeChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbTimeChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbLevelChanged)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::polyStateChanged)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int , QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::programChanged)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::lcdStateChanged)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::midiMessageLEDStateChanged)) {
                *result = 8;
                return;
            }
        }
    }
}